

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

bool __thiscall
ON_OutlineAccumulator::BeginFigure
          (ON_OutlineAccumulator *this,Type point_type,ON_2fPoint point_location)

{
  bool bVar1;
  Type point_type_local;
  ON_OutlineAccumulator *this_local;
  ON_2fPoint point_location_local;
  
  if (this[4] == (ON_OutlineAccumulator)0x1) {
    bVar1 = ON_OutlineFigurePoint::IsBeginFigurePointType(point_type);
    if (bVar1) {
      point_location_local.x._3_1_ = Internal_AccumulatePoint(this,point_type,point_location,true);
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                 ,0x989,"","Invalid point_type for BeginFigure2f.");
      Internal_AccumulateError(this,true);
      point_location_local.x._3_1_ = false;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,0x982,"","ON_OutlineAccumulator is not initialized.");
    Internal_AccumulateError(this,true);
    point_location_local.x._3_1_ = false;
  }
  return point_location_local.x._3_1_;
}

Assistant:

bool ON_OutlineAccumulator::BeginFigure(
  ON_OutlineFigurePoint::Type point_type,
  ON_2fPoint point_location
)
{
  if (1 != m_status)
  {
    ON_ERROR("ON_OutlineAccumulator is not initialized.");
    Internal_AccumulateError(true);
    return false;
  }

  if ( false == ON_OutlineFigurePoint::IsBeginFigurePointType(point_type) )
  {
    ON_ERROR("Invalid point_type for BeginFigure2f.");
    Internal_AccumulateError(true);
    return false;
  }

  return Internal_AccumulatePoint(point_type,point_location, true);
}